

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd_txfm_impl_sse2.h
# Opt level: O2

void aom_fdct4x4_sse2(int16_t *input,tran_low_t *output,int stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar6 [16];
  __m128i in1;
  __m128i in0;
  __m128i local_38;
  __m128i local_28;
  undefined1 auVar3 [16];
  undefined1 auVar7 [16];
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar5 [16];
  undefined1 auVar9 [16];
  
  fdct4x4_helper(input,stride,&local_28,&local_38);
  auVar1 = psraw((undefined1  [16])local_28,0xf);
  auVar5._0_12_ = local_28._0_12_;
  auVar5._12_2_ = local_28[0]._6_2_;
  auVar5._14_2_ = auVar1._6_2_;
  auVar4._12_4_ = auVar5._12_4_;
  auVar4._0_10_ = local_28._0_10_;
  auVar4._10_2_ = auVar1._4_2_;
  auVar3._10_6_ = auVar4._10_6_;
  auVar3._0_8_ = local_28[0];
  auVar3._8_2_ = local_28[0]._4_2_;
  auVar2._8_8_ = auVar3._8_8_;
  auVar2._6_2_ = auVar1._2_2_;
  auVar2._4_2_ = local_28[0]._2_2_;
  auVar2._0_2_ = (undefined2)local_28[0];
  auVar2._2_2_ = auVar1._0_2_;
  *(undefined1 (*) [16])output = auVar2;
  *(short *)(output + 4) = (short)local_28[1];
  *(short *)((long)output + 0x12) = auVar1._8_2_;
  *(short *)(output + 5) = local_28[1]._2_2_;
  *(short *)((long)output + 0x16) = auVar1._10_2_;
  *(short *)(output + 6) = local_28[1]._4_2_;
  *(short *)((long)output + 0x1a) = auVar1._12_2_;
  *(short *)(output + 7) = local_28[1]._6_2_;
  *(short *)((long)output + 0x1e) = auVar1._14_2_;
  auVar1 = psraw((undefined1  [16])local_38,0xf);
  auVar9._0_12_ = local_38._0_12_;
  auVar9._12_2_ = local_38[0]._6_2_;
  auVar9._14_2_ = auVar1._6_2_;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._0_10_ = local_38._0_10_;
  auVar8._10_2_ = auVar1._4_2_;
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._0_8_ = local_38[0];
  auVar7._8_2_ = local_38[0]._4_2_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = auVar1._2_2_;
  auVar6._4_2_ = local_38[0]._2_2_;
  auVar6._0_2_ = (undefined2)local_38[0];
  auVar6._2_2_ = auVar1._0_2_;
  *(undefined1 (*) [16])(output + 8) = auVar6;
  *(short *)(output + 0xc) = (short)local_38[1];
  *(short *)((long)output + 0x32) = auVar1._8_2_;
  *(short *)(output + 0xd) = local_38[1]._2_2_;
  *(short *)((long)output + 0x36) = auVar1._10_2_;
  *(short *)(output + 0xe) = local_38[1]._4_2_;
  *(short *)((long)output + 0x3a) = auVar1._12_2_;
  *(short *)(output + 0xf) = local_38[1]._6_2_;
  *(short *)((long)output + 0x3e) = auVar1._14_2_;
  return;
}

Assistant:

void FDCT4x4_2D(const int16_t *input, tran_low_t *output, int stride) {
  // This 2D transform implements 4 vertical 1D transforms followed
  // by 4 horizontal 1D transforms.  The multiplies and adds are as given
  // by Chen, Smith and Fralick ('77).  The commands for moving the data
  // around have been minimized by hand.
  // For the purposes of the comments, the 16 inputs are referred to at i0
  // through iF (in raster order), intermediate variables are a0, b0, c0
  // through f, and correspond to the in-place computations mapped to input
  // locations.  The outputs, o0 through oF are labeled according to the
  // output locations.
  __m128i in0, in1;
  FDCT4x4_2D_HELPER(input, stride, &in0, &in1);

  // Post-condition (v + 1) >> 2 is now incorporated into previous
  // add and right-shift commands.  Only 2 store instructions needed
  // because we are using the fact that 1/3 are stored just after 0/2.
  storeu_output(&in0, output + 0 * 4);
  storeu_output(&in1, output + 2 * 4);
}